

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::Parent::eraseAfter(Parent *this,uint i)

{
  uint i_local;
  Parent *this_local;
  
  amove<kj::_::BTreeImpl::MaybeUint>(this->keys + i,this->keys + (ulong)i + 1,7 - (ulong)(i + 1));
  MaybeUint::operator=(this->keys + 6,(void *)0x0);
  amove<unsigned_int>(this->children + (ulong)i + 1,this->children + (ulong)i + 2,8 - (ulong)(i + 2)
                     );
  this->children[7] = 0;
  return;
}

Assistant:

void BTreeImpl::Parent::eraseAfter(uint i) {
  amove(keys + i, keys + i + 1, Parent::NKEYS - (i + 1));
  keys[Parent::NKEYS - 1] = nullptr;
  amove(children + i + 1, children + i + 2, Parent::NCHILDREN - (i + 2));
  children[Parent::NCHILDREN - 1] = 0;
}